

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOSTypes.cpp
# Opt level: O2

string * __thiscall
adios2::ToString_abi_cxx11_(string *__return_storage_ptr__,adios2 *this,Box<Dims> *box)

{
  Dims *dims;
  Dims *dims_00;
  string local_30;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"{",(allocator *)&local_30);
  ToString_abi_cxx11_(&local_30,this,dims);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  ToString_abi_cxx11_(&local_30,this + 0x18,dims_00);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(const Box<Dims> &box)
{
    std::string s = "{";
    s += ToString(box.first);
    s += ",";
    s += ToString(box.second);
    s += "}";
    return s;
}